

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.c
# Opt level: O0

_Bool rtosc_match_char(char **path,char **pattern)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  bool bVar5;
  char range_high;
  char to_match;
  char last_range;
  _Bool negation;
  _Bool matched;
  char **pattern_local;
  char **path_local;
  _Bool local_1;
  
  if ((**path == **pattern) && (**path != '\0')) {
    *path = *path + 1;
    *pattern = *pattern + 1;
    local_1 = true;
  }
  else if ((**pattern == '?') && (*path != (char *)0x0)) {
    *path = *path + 1;
    *pattern = *pattern + 1;
    local_1 = true;
  }
  else if (**pattern == '[') {
    matched = false;
    cVar1 = **path;
    *pattern = *pattern + 1;
    cVar2 = **pattern;
    if (cVar2 == '!') {
      *pattern = *pattern + 1;
    }
    while( true ) {
      bVar5 = false;
      if (**pattern != '\0') {
        bVar5 = **pattern != ']';
      }
      if (!bVar5) break;
      cVar3 = **pattern;
      if (**pattern == cVar1) {
        matched = true;
      }
      else if (**pattern == '-') {
        *pattern = *pattern + 1;
        cVar4 = **pattern;
        if ((cVar4 == ']') || (cVar4 == '\0')) break;
        if ((cVar1 <= cVar4) && (cVar3 <= cVar1)) {
          matched = true;
        }
      }
      *pattern = *pattern + 1;
    }
    if (**pattern == ']') {
      *pattern = *pattern + 1;
    }
    *path = *path + 1;
    local_1 = (cVar2 == '!') != matched;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool rtosc_match_char(const char **path, const char **pattern)
{
    //printf("rtosc_match_char('%s','%s')\n", *path, *pattern);
    if(**path == **pattern && **path) {
        ++*path;
        ++*pattern;
        return true;
    } else if(**pattern == '?' && *path) {
        ++*path;
        ++*pattern;
        return true;
    } else if(**pattern == '[') {
        bool matched    = false;
        bool negation   = false;
        char last_range = '\0';
        char to_match   = **path;
        ++*pattern;
        if(**pattern == '!') {
            negation = true;
            ++*pattern;
        }
        while(**pattern && **pattern != ']') {
            last_range = **pattern;
            if(**pattern == to_match) {
                matched = true;
            } else if(**pattern == '-') {//range
                ++*pattern;
                char range_high = **pattern;
                if(range_high == ']' || !range_high)
                    break;
                if(to_match <= range_high && to_match >= last_range)
                    matched = true;
            }
            ++*pattern;
        }
        if(**pattern == ']')
            ++*pattern;
        ++*path;
        return negation ^ matched;
    }
    return false;
}